

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  vfloat<4> vVar5;
  BVH *bvh;
  Scene *pSVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [12];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  uint uVar33;
  undefined4 uVar34;
  int iVar35;
  long lVar36;
  NodeRef root;
  size_t sVar37;
  size_t sVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  NodeRef *pNVar42;
  ulong uVar43;
  ulong uVar44;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar66;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  undefined1 auVar116 [48];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar164 [16];
  undefined1 auVar168 [64];
  undefined1 auVar170 [16];
  float fVar169;
  float fVar175;
  undefined1 auVar171 [16];
  float fVar173;
  float fVar174;
  undefined1 auVar172 [64];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar176;
  float fVar177;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar180 [64];
  Precalculations pre;
  float local_38b8;
  float fStack_38b4;
  float fStack_38b0;
  undefined1 local_3878 [16];
  RayK<4> *local_3860;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  float local_37b8;
  float fStack_37b4;
  float fStack_37b0;
  RTCHitN local_3718 [16];
  undefined1 local_3708 [16];
  undefined1 local_36f8 [16];
  undefined1 local_36e8 [16];
  undefined1 local_36d8 [16];
  undefined1 local_36c8 [16];
  undefined1 local_36b8 [16];
  uint local_36a8;
  uint uStack_36a4;
  uint uStack_36a0;
  uint uStack_369c;
  uint uStack_3698;
  uint uStack_3694;
  uint uStack_3690;
  uint uStack_368c;
  TravRayK<4,_true> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar32 = mm_lookupmask_ps._248_8_;
  uVar31 = mm_lookupmask_ps._240_8_;
  uVar30 = mm_lookupmask_ps._8_8_;
  uVar29 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar74 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar65 = vpcmpeqd_avx(auVar74,(undefined1  [16])valid_i->field_0);
    auVar75 = ZEXT816(0) << 0x40;
    auVar14 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar75,5);
    auVar88 = auVar65 & auVar14;
    if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar88[0xf] < '\0')
    {
      auVar14 = vandps_avx(auVar14,auVar65);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar161._8_4_ = 0x7fffffff;
      auVar161._0_8_ = 0x7fffffff7fffffff;
      auVar161._12_4_ = 0x7fffffff;
      auVar65 = vandps_avx(auVar161,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar154._8_4_ = 0x219392ef;
      auVar154._0_8_ = 0x219392ef219392ef;
      auVar154._12_4_ = 0x219392ef;
      auVar88 = vcmpps_avx(auVar65,auVar154,1);
      auVar164._8_4_ = 0x3f800000;
      auVar164._0_8_ = 0x3f8000003f800000;
      auVar164._12_4_ = 0x3f800000;
      auVar81 = vdivps_avx(auVar164,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar65 = vandps_avx(auVar161,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar132 = vcmpps_avx(auVar65,auVar154,1);
      auVar82 = vdivps_avx(auVar164,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar65 = vandps_avx(auVar161,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar65 = vcmpps_avx(auVar65,auVar154,1);
      auVar89 = vdivps_avx(auVar164,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar155._8_4_ = 0x5d5e0b6b;
      auVar155._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar155._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar81,auVar155,auVar88);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar82,auVar155,auVar132)
      ;
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar89,auVar155,auVar65);
      auVar65 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar75,1);
      auVar81._8_4_ = 0x20;
      auVar81._0_8_ = 0x2000000020;
      auVar81._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar65,auVar81);
      auVar65 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar75,5);
      auVar88._8_4_ = 0x40;
      auVar88._0_8_ = 0x4000000040;
      auVar88._12_4_ = 0x40;
      auVar82._8_4_ = 0x60;
      auVar82._0_8_ = 0x6000000060;
      auVar82._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar82,auVar88,auVar65);
      auVar65 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar75,5);
      auVar132._8_4_ = 0x80;
      auVar132._0_8_ = 0x8000000080;
      auVar132._12_4_ = 0x80;
      auVar89._8_4_ = 0xa0;
      auVar89._0_8_ = 0xa0000000a0;
      auVar89._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar89,auVar132,auVar65)
      ;
      auVar65 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar75);
      auVar88 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar75);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar168 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar65,auVar14);
      auVar65._8_4_ = 0xff800000;
      auVar65._0_8_ = 0xff800000ff800000;
      auVar65._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar65,auVar88,auVar14);
      auVar115 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
      terminated.field_0.i[1] = auVar14._4_4_ ^ auVar74._4_4_;
      terminated.field_0.i[0] = auVar14._0_4_ ^ auVar74._0_4_;
      terminated.field_0.i[2] = auVar14._8_4_ ^ auVar74._8_4_;
      terminated.field_0.i[3] = auVar14._12_4_ ^ auVar74._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar41 = 3;
      }
      else {
        uVar41 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_3860 = ray + 0x80;
      pNVar42 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar45 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_005ad10d:
      do {
        do {
          root.ptr = pNVar42[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_005ae395;
          pNVar42 = pNVar42 + -1;
          paVar45 = paVar45 + -1;
          vVar5.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar45->v;
          auVar93 = ZEXT1664((undefined1  [16])vVar5.field_0);
          auVar74 = vcmpps_avx((undefined1  [16])vVar5.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar33 = vmovmskps_avx(auVar74);
        } while (uVar33 == 0);
        uVar44 = (ulong)(uVar33 & 0xff);
        uVar33 = POPCOUNT(uVar33 & 0xff);
        if (uVar41 < uVar33) {
LAB_005ad14d:
          do {
            iVar35 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005ae395;
              auVar74 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar93._0_16_,6);
              if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar74 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar74 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar74[0xf]) goto LAB_005ad10d;
              uVar44 = (ulong)((uint)root.ptr & 0xf);
              if (uVar44 == 8) {
                auVar74 = vpcmpeqd_avx(auVar115._0_16_,auVar115._0_16_);
                aVar66 = terminated.field_0;
                goto LAB_005ae27e;
              }
              auVar75._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar75._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar75._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar36 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              uVar40 = 0;
              goto LAB_005ad341;
            }
            lVar36 = 0;
            sVar38 = 8;
            auVar74 = auVar168._0_16_;
            do {
              sVar37 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar36 * 8);
              if (sVar37 == 8) {
                auVar93 = ZEXT1664(auVar74);
                break;
              }
              uVar34 = *(undefined4 *)(root.ptr + 0x40 + lVar36 * 4);
              auVar67._4_4_ = uVar34;
              auVar67._0_4_ = uVar34;
              auVar67._8_4_ = uVar34;
              auVar67._12_4_ = uVar34;
              auVar20._8_8_ = tray.org.field_0._8_8_;
              auVar20._0_8_ = tray.org.field_0._0_8_;
              auVar21._8_8_ = tray.org.field_0._24_8_;
              auVar21._0_8_ = tray.org.field_0._16_8_;
              auVar22._8_8_ = tray.org.field_0._40_8_;
              auVar22._0_8_ = tray.org.field_0._32_8_;
              auVar65 = vsubps_avx(auVar67,auVar20);
              auVar137._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar65._0_4_;
              auVar137._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar65._4_4_;
              auVar137._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar65._8_4_;
              auVar137._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar65._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0x80 + lVar36 * 4);
              auVar68._4_4_ = uVar34;
              auVar68._0_4_ = uVar34;
              auVar68._8_4_ = uVar34;
              auVar68._12_4_ = uVar34;
              auVar65 = vsubps_avx(auVar68,auVar21);
              auVar146._0_4_ = tray.rdir.field_0._16_4_ * auVar65._0_4_;
              auVar146._4_4_ = tray.rdir.field_0._20_4_ * auVar65._4_4_;
              auVar146._8_4_ = tray.rdir.field_0._24_4_ * auVar65._8_4_;
              auVar146._12_4_ = tray.rdir.field_0._28_4_ * auVar65._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0xc0 + lVar36 * 4);
              auVar69._4_4_ = uVar34;
              auVar69._0_4_ = uVar34;
              auVar69._8_4_ = uVar34;
              auVar69._12_4_ = uVar34;
              auVar65 = vsubps_avx(auVar69,auVar22);
              auVar159._0_4_ = tray.rdir.field_0._32_4_ * auVar65._0_4_;
              auVar159._4_4_ = tray.rdir.field_0._36_4_ * auVar65._4_4_;
              auVar159._8_4_ = tray.rdir.field_0._40_4_ * auVar65._8_4_;
              auVar159._12_4_ = tray.rdir.field_0._44_4_ * auVar65._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0x60 + lVar36 * 4);
              auVar70._4_4_ = uVar34;
              auVar70._0_4_ = uVar34;
              auVar70._8_4_ = uVar34;
              auVar70._12_4_ = uVar34;
              auVar65 = vsubps_avx(auVar70,auVar20);
              auVar94._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar65._0_4_;
              auVar94._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar65._4_4_;
              auVar94._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar65._8_4_;
              auVar94._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar65._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0xa0 + lVar36 * 4);
              auVar71._4_4_ = uVar34;
              auVar71._0_4_ = uVar34;
              auVar71._8_4_ = uVar34;
              auVar71._12_4_ = uVar34;
              auVar65 = vsubps_avx(auVar71,auVar21);
              auVar117._0_4_ = tray.rdir.field_0._16_4_ * auVar65._0_4_;
              auVar117._4_4_ = tray.rdir.field_0._20_4_ * auVar65._4_4_;
              auVar117._8_4_ = tray.rdir.field_0._24_4_ * auVar65._8_4_;
              auVar117._12_4_ = tray.rdir.field_0._28_4_ * auVar65._12_4_;
              uVar34 = *(undefined4 *)(root.ptr + 0xe0 + lVar36 * 4);
              auVar72._4_4_ = uVar34;
              auVar72._0_4_ = uVar34;
              auVar72._8_4_ = uVar34;
              auVar72._12_4_ = uVar34;
              auVar65 = vsubps_avx(auVar72,auVar22);
              auVar129._0_4_ = tray.rdir.field_0._32_4_ * auVar65._0_4_;
              auVar129._4_4_ = tray.rdir.field_0._36_4_ * auVar65._4_4_;
              auVar129._8_4_ = tray.rdir.field_0._40_4_ * auVar65._8_4_;
              auVar129._12_4_ = tray.rdir.field_0._44_4_ * auVar65._12_4_;
              auVar65 = vminps_avx(auVar137,auVar94);
              auVar88 = vminps_avx(auVar146,auVar117);
              auVar65 = vmaxps_avx(auVar65,auVar88);
              auVar88 = vminps_avx(auVar159,auVar129);
              auVar65 = vmaxps_avx(auVar65,auVar88);
              auVar73._0_4_ = auVar172._0_4_ * auVar65._0_4_;
              auVar73._4_4_ = auVar172._4_4_ * auVar65._4_4_;
              auVar73._8_4_ = auVar172._8_4_ * auVar65._8_4_;
              auVar73._12_4_ = auVar172._12_4_ * auVar65._12_4_;
              auVar65 = vmaxps_avx(auVar137,auVar94);
              auVar88 = vmaxps_avx(auVar146,auVar117);
              auVar88 = vminps_avx(auVar65,auVar88);
              auVar65 = vmaxps_avx(auVar159,auVar129);
              auVar65 = vminps_avx(auVar88,auVar65);
              auVar95._0_4_ = auVar180._0_4_ * auVar65._0_4_;
              auVar95._4_4_ = auVar180._4_4_ * auVar65._4_4_;
              auVar95._8_4_ = auVar180._8_4_ * auVar65._8_4_;
              auVar95._12_4_ = auVar180._12_4_ * auVar65._12_4_;
              auVar65 = vmaxps_avx(auVar73,(undefined1  [16])tray.tnear.field_0);
              auVar88 = vminps_avx(auVar95,(undefined1  [16])tray.tfar.field_0);
              auVar65 = vcmpps_avx(auVar65,auVar88,2);
              auVar115 = ZEXT1664(auVar65);
              if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar65 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar65 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar65[0xf]) {
                auVar93 = ZEXT1664(auVar74);
                sVar37 = sVar38;
              }
              else {
                auVar65 = vblendvps_avx(auVar168._0_16_,auVar73,auVar65);
                auVar93 = ZEXT1664(auVar65);
                if (sVar38 != 8) {
                  pNVar42->ptr = sVar38;
                  pNVar42 = pNVar42 + 1;
                  *(undefined1 (*) [16])paVar45->v = auVar74;
                  paVar45 = paVar45 + 1;
                }
              }
              lVar36 = lVar36 + 1;
              auVar74 = auVar93._0_16_;
              sVar38 = sVar37;
            } while (lVar36 != 8);
            root.ptr = sVar38;
            if (root.ptr == 8) goto LAB_005ad2de;
            auVar74 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar93._0_16_,6);
            uVar34 = vmovmskps_avx(auVar74);
          } while ((byte)uVar41 < (byte)POPCOUNT(uVar34));
          pNVar42->ptr = root.ptr;
          pNVar42 = pNVar42 + 1;
          *paVar45 = auVar93._0_16_;
          paVar45 = paVar45 + 1;
        }
        else {
          do {
            sVar38 = 0;
            for (uVar40 = uVar44; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
              sVar38 = sVar38 + 1;
            }
            auVar115 = ZEXT1664(auVar115._0_16_);
            bVar46 = occluded1(This,bvh,root,sVar38,&pre,ray,&tray,context);
            if (bVar46) {
              terminated.field_0.i[sVar38] = -1;
            }
            uVar44 = uVar44 - 1 & uVar44;
          } while (uVar44 != 0);
          auVar74 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar35 = 3;
          if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar74[0xf] < '\0') {
            auVar74._8_4_ = 0xff800000;
            auVar74._0_8_ = 0xff800000ff800000;
            auVar74._12_4_ = 0xff800000;
            auVar115 = ZEXT1664(auVar74);
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar74,
                               (undefined1  [16])terminated.field_0);
            iVar35 = 2;
          }
          auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar93 = ZEXT1664((undefined1  [16])vVar5.field_0);
          if (uVar41 < uVar33) goto LAB_005ad14d;
        }
LAB_005ad2de:
      } while (iVar35 != 3);
LAB_005ae395:
      auVar14 = vandps_avx(auVar14,(undefined1  [16])terminated.field_0);
      auVar92._8_4_ = 0xff800000;
      auVar92._0_8_ = 0xff800000ff800000;
      auVar92._12_4_ = 0xff800000;
      auVar14 = vmaskmovps_avx(auVar14,auVar92);
      *(undefined1 (*) [16])local_3860 = auVar14;
    }
  }
  return;
  while( true ) {
    uVar40 = uVar40 + 1;
    lVar36 = lVar36 + 0x60;
    auVar75 = auVar65;
    if (uVar44 - 8 <= uVar40) break;
LAB_005ad341:
    pSVar6 = context->scene;
    auVar93 = ZEXT1664(auVar75);
    uVar43 = 0;
    while( true ) {
      auVar74 = auVar93._0_16_;
      iVar35 = *(int *)(lVar36 + uVar43 * 4);
      if (iVar35 == -1) break;
      uVar33 = *(uint *)(lVar36 + -0x10 + uVar43 * 4);
      pfVar7 = (pSVar6->vertices).items[uVar33];
      uVar39 = (ulong)*(uint *)(lVar36 + -0x50 + uVar43 * 4);
      fVar1 = pfVar7[uVar39];
      auVar47._4_4_ = fVar1;
      auVar47._0_4_ = fVar1;
      auVar47._8_4_ = fVar1;
      auVar47._12_4_ = fVar1;
      fVar1 = pfVar7[uVar39 + 1];
      auVar96._4_4_ = fVar1;
      auVar96._0_4_ = fVar1;
      auVar96._8_4_ = fVar1;
      auVar96._12_4_ = fVar1;
      fVar1 = pfVar7[uVar39 + 2];
      auVar118._4_4_ = fVar1;
      auVar118._0_4_ = fVar1;
      auVar118._8_4_ = fVar1;
      auVar118._12_4_ = fVar1;
      uVar39 = (ulong)*(uint *)(lVar36 + -0x20 + uVar43 * 4);
      fVar1 = pfVar7[uVar39];
      auVar76._4_4_ = fVar1;
      auVar76._0_4_ = fVar1;
      auVar76._8_4_ = fVar1;
      auVar76._12_4_ = fVar1;
      fVar1 = pfVar7[uVar39 + 1];
      auVar133._4_4_ = fVar1;
      auVar133._0_4_ = fVar1;
      auVar133._8_4_ = fVar1;
      auVar133._12_4_ = fVar1;
      fVar1 = pfVar7[uVar39 + 2];
      auVar138._4_4_ = fVar1;
      auVar138._0_4_ = fVar1;
      auVar138._8_4_ = fVar1;
      auVar138._12_4_ = fVar1;
      auVar65 = *(undefined1 (*) [16])ray;
      auVar88 = *(undefined1 (*) [16])(ray + 0x10);
      auVar132 = *(undefined1 (*) [16])(ray + 0x20);
      auVar89 = vsubps_avx(auVar47,auVar65);
      auVar154 = vsubps_avx(auVar96,auVar88);
      auVar155 = vsubps_avx(auVar118,auVar132);
      auVar164 = vsubps_avx(auVar133,auVar88);
      auVar47 = vsubps_avx(auVar138,auVar132);
      auVar96 = vsubps_avx(auVar164,auVar154);
      auVar118 = vsubps_avx(auVar47,auVar155);
      auVar156._0_4_ = auVar164._0_4_ + auVar154._0_4_;
      auVar156._4_4_ = auVar164._4_4_ + auVar154._4_4_;
      auVar156._8_4_ = auVar164._8_4_ + auVar154._8_4_;
      auVar156._12_4_ = auVar164._12_4_ + auVar154._12_4_;
      fVar10 = auVar155._0_4_;
      auVar162._0_4_ = auVar47._0_4_ + fVar10;
      fVar11 = auVar155._4_4_;
      auVar162._4_4_ = auVar47._4_4_ + fVar11;
      fVar12 = auVar155._8_4_;
      auVar162._8_4_ = auVar47._8_4_ + fVar12;
      fVar13 = auVar155._12_4_;
      auVar162._12_4_ = auVar47._12_4_ + fVar13;
      auVar170._0_4_ = auVar156._0_4_ * auVar118._0_4_;
      auVar170._4_4_ = auVar156._4_4_ * auVar118._4_4_;
      auVar170._8_4_ = auVar156._8_4_ * auVar118._8_4_;
      auVar170._12_4_ = auVar156._12_4_ * auVar118._12_4_;
      auVar165 = vfmsub231ps_fma(auVar170,auVar96,auVar162);
      auVar170 = vsubps_avx(auVar76,auVar65);
      auVar53 = vsubps_avx(auVar170,auVar89);
      auVar163._0_4_ = auVar162._0_4_ * auVar53._0_4_;
      auVar163._4_4_ = auVar162._4_4_ * auVar53._4_4_;
      auVar163._8_4_ = auVar162._8_4_ * auVar53._8_4_;
      auVar163._12_4_ = auVar162._12_4_ * auVar53._12_4_;
      auVar178._0_4_ = auVar170._0_4_ + auVar89._0_4_;
      auVar178._4_4_ = auVar170._4_4_ + auVar89._4_4_;
      auVar178._8_4_ = auVar170._8_4_ + auVar89._8_4_;
      auVar178._12_4_ = auVar170._12_4_ + auVar89._12_4_;
      auVar82 = vfmsub231ps_fma(auVar163,auVar118,auVar178);
      auVar179._0_4_ = auVar178._0_4_ * auVar96._0_4_;
      auVar179._4_4_ = auVar178._4_4_ * auVar96._4_4_;
      auVar179._8_4_ = auVar178._8_4_ * auVar96._8_4_;
      auVar179._12_4_ = auVar178._12_4_ * auVar96._12_4_;
      auVar81 = vfmsub231ps_fma(auVar179,auVar53,auVar156);
      fVar2 = *(float *)(ray + 0x60);
      fVar3 = *(float *)(ray + 100);
      fVar19 = *(float *)(ray + 0x68);
      auVar28 = *(undefined1 (*) [12])(ray + 0x60);
      fVar177 = *(float *)(ray + 0x6c);
      auVar157._0_4_ = auVar81._0_4_ * fVar2;
      auVar157._4_4_ = auVar81._4_4_ * fVar3;
      auVar157._8_4_ = auVar81._8_4_ * fVar19;
      auVar157._12_4_ = auVar81._12_4_ * fVar177;
      auVar81 = *(undefined1 (*) [16])(ray + 0x50);
      auVar156 = vfmadd231ps_fma(auVar157,auVar81,auVar82);
      auVar82 = *(undefined1 (*) [16])(ray + 0x40);
      auVar157 = vfmadd231ps_fma(auVar156,auVar82,auVar165);
      uVar39 = (ulong)*(uint *)(lVar36 + -0x40 + uVar43 * 4);
      fVar1 = pfVar7[uVar39];
      auVar77._4_4_ = fVar1;
      auVar77._0_4_ = fVar1;
      auVar77._8_4_ = fVar1;
      auVar77._12_4_ = fVar1;
      auVar65 = vsubps_avx(auVar77,auVar65);
      fVar1 = pfVar7[uVar39 + 1];
      auVar97._4_4_ = fVar1;
      auVar97._0_4_ = fVar1;
      auVar97._8_4_ = fVar1;
      auVar97._12_4_ = fVar1;
      auVar88 = vsubps_avx(auVar97,auVar88);
      fVar1 = pfVar7[uVar39 + 2];
      auVar134._4_4_ = fVar1;
      auVar134._0_4_ = fVar1;
      auVar134._8_4_ = fVar1;
      auVar134._12_4_ = fVar1;
      auVar132 = vsubps_avx(auVar134,auVar132);
      auVar156 = vsubps_avx(auVar154,auVar88);
      auVar155 = vsubps_avx(auVar155,auVar132);
      auVar130._0_4_ = auVar154._0_4_ + auVar88._0_4_;
      auVar130._4_4_ = auVar154._4_4_ + auVar88._4_4_;
      auVar130._8_4_ = auVar154._8_4_ + auVar88._8_4_;
      auVar130._12_4_ = auVar154._12_4_ + auVar88._12_4_;
      auVar147._0_4_ = fVar10 + auVar132._0_4_;
      auVar147._4_4_ = fVar11 + auVar132._4_4_;
      auVar147._8_4_ = fVar12 + auVar132._8_4_;
      auVar147._12_4_ = fVar13 + auVar132._12_4_;
      fVar176 = auVar155._0_4_;
      auVar165._0_4_ = fVar176 * auVar130._0_4_;
      fVar181 = auVar155._4_4_;
      auVar165._4_4_ = fVar181 * auVar130._4_4_;
      fVar182 = auVar155._8_4_;
      auVar165._8_4_ = fVar182 * auVar130._8_4_;
      fVar183 = auVar155._12_4_;
      auVar165._12_4_ = fVar183 * auVar130._12_4_;
      auVar162 = vfmsub231ps_fma(auVar165,auVar156,auVar147);
      auVar165 = vsubps_avx(auVar89,auVar65);
      fVar15 = auVar165._0_4_;
      auVar148._0_4_ = auVar147._0_4_ * fVar15;
      fVar16 = auVar165._4_4_;
      auVar148._4_4_ = auVar147._4_4_ * fVar16;
      fVar17 = auVar165._8_4_;
      auVar148._8_4_ = auVar147._8_4_ * fVar17;
      fVar18 = auVar165._12_4_;
      auVar148._12_4_ = auVar147._12_4_ * fVar18;
      auVar139._0_4_ = auVar89._0_4_ + auVar65._0_4_;
      auVar139._4_4_ = auVar89._4_4_ + auVar65._4_4_;
      auVar139._8_4_ = auVar89._8_4_ + auVar65._8_4_;
      auVar139._12_4_ = auVar89._12_4_ + auVar65._12_4_;
      auVar147 = vfmsub231ps_fma(auVar148,auVar155,auVar139);
      fVar169 = auVar156._0_4_;
      auVar140._0_4_ = fVar169 * auVar139._0_4_;
      fVar173 = auVar156._4_4_;
      auVar140._4_4_ = fVar173 * auVar139._4_4_;
      fVar174 = auVar156._8_4_;
      auVar140._8_4_ = fVar174 * auVar139._8_4_;
      fVar175 = auVar156._12_4_;
      auVar140._12_4_ = fVar175 * auVar139._12_4_;
      auVar48 = vfmsub231ps_fma(auVar140,auVar165,auVar130);
      auVar131._0_4_ = fVar2 * auVar48._0_4_;
      auVar131._4_4_ = fVar3 * auVar48._4_4_;
      auVar131._8_4_ = fVar19 * auVar48._8_4_;
      auVar131._12_4_ = fVar177 * auVar48._12_4_;
      auVar147 = vfmadd231ps_fma(auVar131,auVar81,auVar147);
      auVar162 = vfmadd231ps_fma(auVar147,auVar82,auVar162);
      auVar147 = vsubps_avx(auVar65,auVar170);
      auVar48._0_4_ = auVar65._0_4_ + auVar170._0_4_;
      auVar48._4_4_ = auVar65._4_4_ + auVar170._4_4_;
      auVar48._8_4_ = auVar65._8_4_ + auVar170._8_4_;
      auVar48._12_4_ = auVar65._12_4_ + auVar170._12_4_;
      auVar170 = vsubps_avx(auVar88,auVar164);
      auVar78._0_4_ = auVar164._0_4_ + auVar88._0_4_;
      auVar78._4_4_ = auVar164._4_4_ + auVar88._4_4_;
      auVar78._8_4_ = auVar164._8_4_ + auVar88._8_4_;
      auVar78._12_4_ = auVar164._12_4_ + auVar88._12_4_;
      auVar164 = vsubps_avx(auVar132,auVar47);
      auVar98._0_4_ = auVar132._0_4_ + auVar47._0_4_;
      auVar98._4_4_ = auVar132._4_4_ + auVar47._4_4_;
      auVar98._8_4_ = auVar132._8_4_ + auVar47._8_4_;
      auVar98._12_4_ = auVar132._12_4_ + auVar47._12_4_;
      auVar119._0_4_ = auVar164._0_4_ * auVar78._0_4_;
      auVar119._4_4_ = auVar164._4_4_ * auVar78._4_4_;
      auVar119._8_4_ = auVar164._8_4_ * auVar78._8_4_;
      auVar119._12_4_ = auVar164._12_4_ * auVar78._12_4_;
      auVar88 = vfmsub231ps_fma(auVar119,auVar170,auVar98);
      auVar99._0_4_ = auVar147._0_4_ * auVar98._0_4_;
      auVar99._4_4_ = auVar147._4_4_ * auVar98._4_4_;
      auVar99._8_4_ = auVar147._8_4_ * auVar98._8_4_;
      auVar99._12_4_ = auVar147._12_4_ * auVar98._12_4_;
      auVar65 = vfmsub231ps_fma(auVar99,auVar164,auVar48);
      auVar49._0_4_ = auVar170._0_4_ * auVar48._0_4_;
      auVar49._4_4_ = auVar170._4_4_ * auVar48._4_4_;
      auVar49._8_4_ = auVar170._8_4_ * auVar48._8_4_;
      auVar49._12_4_ = auVar170._12_4_ * auVar48._12_4_;
      auVar132 = vfmsub231ps_fma(auVar49,auVar147,auVar78);
      auVar50._0_4_ = fVar2 * auVar132._0_4_;
      auVar50._4_4_ = fVar3 * auVar132._4_4_;
      auVar50._8_4_ = fVar19 * auVar132._8_4_;
      auVar50._12_4_ = fVar177 * auVar132._12_4_;
      auVar65 = vfmadd231ps_fma(auVar50,auVar81,auVar65);
      auVar47 = vfmadd231ps_fma(auVar65,auVar82,auVar88);
      auVar135._0_4_ = auVar47._0_4_ + auVar157._0_4_ + auVar162._0_4_;
      auVar135._4_4_ = auVar47._4_4_ + auVar157._4_4_ + auVar162._4_4_;
      auVar135._8_4_ = auVar47._8_4_ + auVar157._8_4_ + auVar162._8_4_;
      auVar135._12_4_ = auVar47._12_4_ + auVar157._12_4_ + auVar162._12_4_;
      auVar65 = vminps_avx(auVar157,auVar162);
      auVar88 = vminps_avx(auVar65,auVar47);
      auVar65 = vandps_avx(auVar135,auVar161);
      auVar100._0_4_ = auVar65._0_4_ * 1.1920929e-07;
      auVar100._4_4_ = auVar65._4_4_ * 1.1920929e-07;
      auVar100._8_4_ = auVar65._8_4_ * 1.1920929e-07;
      auVar100._12_4_ = auVar65._12_4_ * 1.1920929e-07;
      auVar115 = ZEXT1664(auVar100);
      uVar39 = CONCAT44(auVar100._4_4_,auVar100._0_4_);
      auVar120._0_8_ = uVar39 ^ 0x8000000080000000;
      auVar120._8_4_ = -auVar100._8_4_;
      auVar120._12_4_ = -auVar100._12_4_;
      auVar88 = vcmpps_avx(auVar88,auVar120,5);
      auVar132 = vmaxps_avx(auVar157,auVar162);
      auVar132 = vmaxps_avx(auVar132,auVar47);
      auVar132 = vcmpps_avx(auVar132,auVar100,2);
      auVar88 = vorps_avx(auVar88,auVar132);
      uVar39 = (ulong)*(uint *)(lVar36 + -0x30 + uVar43 * 4);
      auVar132 = auVar74 & auVar88;
      fVar1 = pfVar7[uVar39];
      fVar2 = pfVar7[uVar39 + 1];
      fVar3 = pfVar7[uVar39 + 2];
      if ((((auVar132 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar132 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar132 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar132[0xf]
         ) {
        auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      }
      else {
        auVar51._0_4_ = fVar169 * auVar118._0_4_;
        auVar51._4_4_ = fVar173 * auVar118._4_4_;
        auVar51._8_4_ = fVar174 * auVar118._8_4_;
        auVar51._12_4_ = fVar175 * auVar118._12_4_;
        auVar79._0_4_ = fVar15 * auVar96._0_4_;
        auVar79._4_4_ = fVar16 * auVar96._4_4_;
        auVar79._8_4_ = fVar17 * auVar96._8_4_;
        auVar79._12_4_ = fVar18 * auVar96._12_4_;
        auVar47 = vfmsub213ps_fma(auVar96,auVar155,auVar51);
        auVar101._0_4_ = auVar170._0_4_ * fVar176;
        auVar101._4_4_ = auVar170._4_4_ * fVar181;
        auVar101._8_4_ = auVar170._8_4_ * fVar182;
        auVar101._12_4_ = auVar170._12_4_ * fVar183;
        auVar121._0_4_ = fVar15 * auVar164._0_4_;
        auVar121._4_4_ = fVar16 * auVar164._4_4_;
        auVar121._8_4_ = fVar17 * auVar164._8_4_;
        auVar121._12_4_ = fVar18 * auVar164._12_4_;
        auVar96 = vfmsub213ps_fma(auVar164,auVar156,auVar101);
        auVar132 = vandps_avx(auVar51,auVar161);
        auVar164 = vandps_avx(auVar101,auVar161);
        auVar132 = vcmpps_avx(auVar132,auVar164,1);
        auVar164 = vblendvps_avx(auVar96,auVar47,auVar132);
        auVar52._0_4_ = auVar147._0_4_ * fVar169;
        auVar52._4_4_ = auVar147._4_4_ * fVar173;
        auVar52._8_4_ = auVar147._8_4_ * fVar174;
        auVar52._12_4_ = auVar147._12_4_ * fVar175;
        auVar47 = vfmsub213ps_fma(auVar147,auVar155,auVar121);
        auVar102._0_4_ = fVar176 * auVar53._0_4_;
        auVar102._4_4_ = fVar181 * auVar53._4_4_;
        auVar102._8_4_ = fVar182 * auVar53._8_4_;
        auVar102._12_4_ = fVar183 * auVar53._12_4_;
        auVar96 = vfmsub213ps_fma(auVar118,auVar165,auVar102);
        auVar132 = vandps_avx(auVar102,auVar161);
        auVar155 = vandps_avx(auVar121,auVar161);
        auVar132 = vcmpps_avx(auVar132,auVar155,1);
        auVar47 = vblendvps_avx(auVar47,auVar96,auVar132);
        auVar96 = vfmsub213ps_fma(auVar53,auVar156,auVar79);
        auVar118 = vfmsub213ps_fma(auVar170,auVar165,auVar52);
        auVar132 = vandps_avx(auVar79,auVar161);
        auVar155 = vandps_avx(auVar52,auVar161);
        auVar132 = vcmpps_avx(auVar132,auVar155,1);
        auVar155 = vblendvps_avx(auVar118,auVar96,auVar132);
        local_37b8 = auVar28._0_4_;
        fStack_37b4 = auVar28._4_4_;
        fStack_37b0 = auVar28._8_4_;
        auVar53._0_4_ = auVar155._0_4_ * local_37b8;
        auVar53._4_4_ = auVar155._4_4_ * fStack_37b4;
        auVar53._8_4_ = auVar155._8_4_ * fStack_37b0;
        auVar53._12_4_ = auVar155._12_4_ * fVar177;
        auVar132 = vfmadd213ps_fma(auVar81,auVar47,auVar53);
        auVar132 = vfmadd213ps_fma(auVar82,auVar164,auVar132);
        auVar54._0_4_ = auVar132._0_4_ + auVar132._0_4_;
        auVar54._4_4_ = auVar132._4_4_ + auVar132._4_4_;
        auVar54._8_4_ = auVar132._8_4_ + auVar132._8_4_;
        auVar54._12_4_ = auVar132._12_4_ + auVar132._12_4_;
        auVar80._0_4_ = auVar155._0_4_ * fVar10;
        auVar80._4_4_ = auVar155._4_4_ * fVar11;
        auVar80._8_4_ = auVar155._8_4_ * fVar12;
        auVar80._12_4_ = auVar155._12_4_ * fVar13;
        auVar132 = vfmadd213ps_fma(auVar154,auVar47,auVar80);
        auVar81 = vfmadd213ps_fma(auVar89,auVar164,auVar132);
        auVar132 = vrcpps_avx(auVar54);
        auVar149._8_4_ = 0x3f800000;
        auVar149._0_8_ = 0x3f8000003f800000;
        auVar149._12_4_ = 0x3f800000;
        auVar82 = vfnmadd213ps_fma(auVar132,auVar54,auVar149);
        auVar132 = vfmadd132ps_fma(auVar82,auVar132,auVar132);
        auVar103._0_4_ = (auVar81._0_4_ + auVar81._0_4_) * auVar132._0_4_;
        auVar103._4_4_ = (auVar81._4_4_ + auVar81._4_4_) * auVar132._4_4_;
        auVar103._8_4_ = (auVar81._8_4_ + auVar81._8_4_) * auVar132._8_4_;
        auVar103._12_4_ = (auVar81._12_4_ + auVar81._12_4_) * auVar132._12_4_;
        auVar115 = ZEXT1664(auVar103);
        auVar132 = *(undefined1 (*) [16])(ray + 0x80);
        auVar81 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar103,2);
        auVar82 = vcmpps_avx(auVar103,auVar132,2);
        auVar81 = vandps_avx(auVar81,auVar82);
        uVar39 = CONCAT44(auVar54._4_4_,auVar54._0_4_);
        auVar122._0_8_ = uVar39 ^ 0x8000000080000000;
        auVar122._8_4_ = -auVar54._8_4_;
        auVar122._12_4_ = -auVar54._12_4_;
        auVar82 = vcmpps_avx(auVar54,auVar122,4);
        auVar81 = vandps_avx(auVar82,auVar81);
        auVar88 = vandps_avx(auVar74,auVar88);
        auVar81 = vpslld_avx(auVar81,0x1f);
        auVar82 = vpsrad_avx(auVar81,0x1f);
        auVar81 = auVar88 & auVar82;
        if ((((auVar81 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar81 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar81 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar81[0xf]
           ) {
          auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar88 = vandps_avx(auVar82,auVar88);
          pGVar8 = (context->scene->geometries).items[uVar33].ptr;
          uVar4 = pGVar8->mask;
          auVar83._4_4_ = uVar4;
          auVar83._0_4_ = uVar4;
          auVar83._8_4_ = uVar4;
          auVar83._12_4_ = uVar4;
          auVar81 = vpand_avx(auVar83,*(undefined1 (*) [16])(ray + 0x90));
          auVar81 = vpcmpeqd_avx(auVar81,_DAT_01f7aa10);
          auVar82 = auVar88 & ~auVar81;
          auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar82[0xf] < '\0') {
            auVar88 = vandnps_avx(auVar81,auVar88);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar81 = vrcpps_avx(auVar135);
              auVar153._8_4_ = 0x3f800000;
              auVar153._0_8_ = 0x3f8000003f800000;
              auVar153._12_4_ = 0x3f800000;
              auVar82 = vfnmadd213ps_fma(auVar135,auVar81,auVar153);
              auVar81 = vfmadd132ps_fma(auVar82,auVar81,auVar81);
              auVar61._8_4_ = 0x219392ef;
              auVar61._0_8_ = 0x219392ef219392ef;
              auVar61._12_4_ = 0x219392ef;
              auVar65 = vcmpps_avx(auVar65,auVar61,5);
              auVar65 = vandps_avx(auVar65,auVar81);
              auVar128._0_4_ = auVar65._0_4_ * auVar157._0_4_;
              auVar128._4_4_ = auVar65._4_4_ * auVar157._4_4_;
              auVar128._8_4_ = auVar65._8_4_ * auVar157._8_4_;
              auVar128._12_4_ = auVar65._12_4_ * auVar157._12_4_;
              auVar81 = vminps_avx(auVar128,auVar153);
              auVar62._0_4_ = auVar162._0_4_ * auVar65._0_4_;
              auVar62._4_4_ = auVar162._4_4_ * auVar65._4_4_;
              auVar62._8_4_ = auVar162._8_4_ * auVar65._8_4_;
              auVar62._12_4_ = auVar162._12_4_ * auVar65._12_4_;
              auVar65 = vminps_avx(auVar62,auVar153);
              auVar82 = vsubps_avx(auVar153,auVar81);
              auVar89 = vsubps_avx(auVar153,auVar65);
              auVar24._8_8_ = uVar30;
              auVar24._0_8_ = uVar29;
              local_36e8 = vblendvps_avx(auVar81,auVar82,auVar24);
              local_36d8 = vblendvps_avx(auVar65,auVar89,auVar24);
              local_36b8._4_4_ = uVar33;
              local_36b8._0_4_ = uVar33;
              local_36b8._8_4_ = uVar33;
              local_36b8._12_4_ = uVar33;
              local_36c8._4_4_ = iVar35;
              local_36c8._0_4_ = iVar35;
              local_36c8._8_4_ = iVar35;
              local_36c8._12_4_ = iVar35;
              vpcmpeqd_avx2(ZEXT1632(local_36d8),ZEXT1632(local_36d8));
              uStack_36a4 = context->user->instID[0];
              local_36a8 = uStack_36a4;
              uStack_36a0 = uStack_36a4;
              uStack_369c = uStack_36a4;
              uStack_3698 = context->user->instPrimID[0];
              uStack_3694 = uStack_3698;
              uStack_3690 = uStack_3698;
              uStack_368c = uStack_3698;
              auVar65 = vblendvps_avx(auVar132,auVar103,auVar88);
              *(undefined1 (*) [16])(ray + 0x80) = auVar65;
              args.valid = (int *)local_3878;
              args.geometryUserPtr = pGVar8->userPtr;
              args.context = context->user;
              args.hit = local_3718;
              args.N = 4;
              local_3878 = auVar88;
              args.ray = (RTCRayN *)ray;
              local_3718 = (RTCHitN  [16])auVar164;
              local_3708 = auVar47;
              local_36f8 = auVar155;
              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar115 = ZEXT1664(auVar103);
                auVar168._0_8_ = (*pGVar8->occlusionFilterN)(&args);
                auVar168._8_56_ = extraout_var;
                auVar65 = auVar168._0_16_;
                auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
              if (local_3878 == (undefined1  [16])0x0) {
                auVar65 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar65 = auVar65 ^ _DAT_01f7ae20;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar172._0_8_ = (*p_Var9)(&args);
                  auVar172._8_56_ = extraout_var_00;
                  auVar65 = auVar172._0_16_;
                  auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                auVar88 = vpcmpeqd_avx(local_3878,_DAT_01f7aa10);
                auVar65 = vpcmpeqd_avx(auVar65,auVar65);
                auVar65 = auVar88 ^ auVar65;
                auVar112._8_4_ = 0xff800000;
                auVar112._0_8_ = 0xff800000ff800000;
                auVar112._12_4_ = 0xff800000;
                auVar115 = ZEXT1664(auVar112);
                auVar88 = vblendvps_avx(auVar112,*(undefined1 (*) [16])(args.ray + 0x80),auVar88);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar88;
              }
              auVar65 = vpslld_avx(auVar65,0x1f);
              auVar88 = vpsrad_avx(auVar65,0x1f);
              auVar65 = vblendvps_avx(auVar132,*(undefined1 (*) [16])local_3860,auVar65);
              *(undefined1 (*) [16])local_3860 = auVar65;
            }
            auVar74 = vpandn_avx(auVar88,auVar74);
          }
        }
      }
      if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar74 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar74 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar74[0xf])
      break;
      auVar65 = *(undefined1 (*) [16])ray;
      auVar88 = *(undefined1 (*) [16])(ray + 0x10);
      auVar132 = *(undefined1 (*) [16])(ray + 0x20);
      auVar27._4_4_ = fVar1;
      auVar27._0_4_ = fVar1;
      auVar27._8_4_ = fVar1;
      auVar27._12_4_ = fVar1;
      auVar89 = vsubps_avx(auVar27,auVar65);
      auVar26._4_4_ = fVar2;
      auVar26._0_4_ = fVar2;
      auVar26._8_4_ = fVar2;
      auVar26._12_4_ = fVar2;
      auVar154 = vsubps_avx(auVar26,auVar88);
      auVar25._4_4_ = fVar3;
      auVar25._0_4_ = fVar3;
      auVar25._8_4_ = fVar3;
      auVar25._12_4_ = fVar3;
      auVar81 = vsubps_avx(auVar25,auVar132);
      auVar82 = vsubps_avx(auVar76,auVar65);
      auVar155 = vsubps_avx(auVar133,auVar88);
      auVar164 = vsubps_avx(auVar138,auVar132);
      auVar47 = vsubps_avx(auVar77,auVar65);
      auVar96 = vsubps_avx(auVar97,auVar88);
      auVar132 = vsubps_avx(auVar134,auVar132);
      auVar118 = vsubps_avx(auVar47,auVar89);
      auVar170 = vsubps_avx(auVar96,auVar154);
      auVar53 = vsubps_avx(auVar132,auVar81);
      auVar150._0_4_ = auVar47._0_4_ + auVar89._0_4_;
      auVar150._4_4_ = auVar47._4_4_ + auVar89._4_4_;
      auVar150._8_4_ = auVar47._8_4_ + auVar89._8_4_;
      auVar150._12_4_ = auVar47._12_4_ + auVar89._12_4_;
      auVar160._0_4_ = auVar96._0_4_ + auVar154._0_4_;
      auVar160._4_4_ = auVar96._4_4_ + auVar154._4_4_;
      auVar160._8_4_ = auVar96._8_4_ + auVar154._8_4_;
      auVar160._12_4_ = auVar96._12_4_ + auVar154._12_4_;
      fVar177 = auVar81._0_4_;
      auVar166._0_4_ = fVar177 + auVar132._0_4_;
      fVar173 = auVar81._4_4_;
      auVar166._4_4_ = fVar173 + auVar132._4_4_;
      fVar175 = auVar81._8_4_;
      auVar166._8_4_ = fVar175 + auVar132._8_4_;
      fVar181 = auVar81._12_4_;
      auVar166._12_4_ = fVar181 + auVar132._12_4_;
      auVar171._0_4_ = auVar160._0_4_ * auVar53._0_4_;
      auVar171._4_4_ = auVar160._4_4_ * auVar53._4_4_;
      auVar171._8_4_ = auVar160._8_4_ * auVar53._8_4_;
      auVar171._12_4_ = auVar160._12_4_ * auVar53._12_4_;
      auVar165 = vfmsub231ps_fma(auVar171,auVar170,auVar166);
      auVar167._0_4_ = auVar166._0_4_ * auVar118._0_4_;
      auVar167._4_4_ = auVar166._4_4_ * auVar118._4_4_;
      auVar167._8_4_ = auVar166._8_4_ * auVar118._8_4_;
      auVar167._12_4_ = auVar166._12_4_ * auVar118._12_4_;
      auVar88 = vfmsub231ps_fma(auVar167,auVar53,auVar150);
      auVar151._0_4_ = auVar150._0_4_ * auVar170._0_4_;
      auVar151._4_4_ = auVar150._4_4_ * auVar170._4_4_;
      auVar151._8_4_ = auVar150._8_4_ * auVar170._8_4_;
      auVar151._12_4_ = auVar150._12_4_ * auVar170._12_4_;
      auVar65 = vfmsub231ps_fma(auVar151,auVar118,auVar160);
      fVar16 = *(float *)(ray + 0x60);
      fVar17 = *(float *)(ray + 100);
      fVar18 = *(float *)(ray + 0x68);
      auVar28 = *(undefined1 (*) [12])(ray + 0x60);
      fVar19 = *(float *)(ray + 0x6c);
      auVar158._0_4_ = auVar65._0_4_ * fVar16;
      auVar158._4_4_ = auVar65._4_4_ * fVar17;
      auVar158._8_4_ = auVar65._8_4_ * fVar18;
      auVar158._12_4_ = auVar65._12_4_ * fVar19;
      auVar65 = *(undefined1 (*) [16])(ray + 0x50);
      auVar156 = vfmadd231ps_fma(auVar158,auVar65,auVar88);
      auVar88 = *(undefined1 (*) [16])(ray + 0x40);
      auVar162 = vfmadd231ps_fma(auVar156,auVar88,auVar165);
      auVar156 = vsubps_avx(auVar154,auVar155);
      auVar165 = vsubps_avx(auVar81,auVar164);
      auVar152._0_4_ = auVar155._0_4_ + auVar154._0_4_;
      auVar152._4_4_ = auVar155._4_4_ + auVar154._4_4_;
      auVar152._8_4_ = auVar155._8_4_ + auVar154._8_4_;
      auVar152._12_4_ = auVar155._12_4_ + auVar154._12_4_;
      auVar104._0_4_ = fVar177 + auVar164._0_4_;
      auVar104._4_4_ = fVar173 + auVar164._4_4_;
      auVar104._8_4_ = fVar175 + auVar164._8_4_;
      auVar104._12_4_ = fVar181 + auVar164._12_4_;
      fVar1 = auVar165._0_4_;
      auVar123._0_4_ = auVar152._0_4_ * fVar1;
      fVar3 = auVar165._4_4_;
      auVar123._4_4_ = auVar152._4_4_ * fVar3;
      fVar11 = auVar165._8_4_;
      auVar123._8_4_ = auVar152._8_4_ * fVar11;
      fVar13 = auVar165._12_4_;
      auVar123._12_4_ = auVar152._12_4_ * fVar13;
      auVar157 = vfmsub231ps_fma(auVar123,auVar156,auVar104);
      auVar147 = vsubps_avx(auVar89,auVar82);
      fVar169 = auVar147._0_4_;
      auVar105._0_4_ = fVar169 * auVar104._0_4_;
      fVar174 = auVar147._4_4_;
      auVar105._4_4_ = fVar174 * auVar104._4_4_;
      fVar176 = auVar147._8_4_;
      auVar105._8_4_ = fVar176 * auVar104._8_4_;
      fVar182 = auVar147._12_4_;
      auVar105._12_4_ = fVar182 * auVar104._12_4_;
      auVar143._0_4_ = auVar89._0_4_ + auVar82._0_4_;
      auVar143._4_4_ = auVar89._4_4_ + auVar82._4_4_;
      auVar143._8_4_ = auVar89._8_4_ + auVar82._8_4_;
      auVar143._12_4_ = auVar89._12_4_ + auVar82._12_4_;
      auVar81 = vfmsub231ps_fma(auVar105,auVar165,auVar143);
      fVar2 = auVar156._0_4_;
      auVar144._0_4_ = auVar143._0_4_ * fVar2;
      fVar10 = auVar156._4_4_;
      auVar144._4_4_ = auVar143._4_4_ * fVar10;
      fVar12 = auVar156._8_4_;
      auVar144._8_4_ = auVar143._8_4_ * fVar12;
      fVar15 = auVar156._12_4_;
      auVar144._12_4_ = auVar143._12_4_ * fVar15;
      auVar48 = vfmsub231ps_fma(auVar144,auVar147,auVar152);
      auVar145._0_4_ = fVar16 * auVar48._0_4_;
      auVar145._4_4_ = fVar17 * auVar48._4_4_;
      auVar145._8_4_ = fVar18 * auVar48._8_4_;
      auVar145._12_4_ = fVar19 * auVar48._12_4_;
      auVar81 = vfmadd231ps_fma(auVar145,auVar65,auVar81);
      auVar48 = vfmadd231ps_fma(auVar81,auVar88,auVar157);
      auVar157 = vsubps_avx(auVar82,auVar47);
      auVar106._0_4_ = auVar82._0_4_ + auVar47._0_4_;
      auVar106._4_4_ = auVar82._4_4_ + auVar47._4_4_;
      auVar106._8_4_ = auVar82._8_4_ + auVar47._8_4_;
      auVar106._12_4_ = auVar82._12_4_ + auVar47._12_4_;
      auVar47 = vsubps_avx(auVar155,auVar96);
      auVar84._0_4_ = auVar155._0_4_ + auVar96._0_4_;
      auVar84._4_4_ = auVar155._4_4_ + auVar96._4_4_;
      auVar84._8_4_ = auVar155._8_4_ + auVar96._8_4_;
      auVar84._12_4_ = auVar155._12_4_ + auVar96._12_4_;
      auVar155 = vsubps_avx(auVar164,auVar132);
      auVar55._0_4_ = auVar164._0_4_ + auVar132._0_4_;
      auVar55._4_4_ = auVar164._4_4_ + auVar132._4_4_;
      auVar55._8_4_ = auVar164._8_4_ + auVar132._8_4_;
      auVar55._12_4_ = auVar164._12_4_ + auVar132._12_4_;
      auVar124._0_4_ = auVar155._0_4_ * auVar84._0_4_;
      auVar124._4_4_ = auVar155._4_4_ * auVar84._4_4_;
      auVar124._8_4_ = auVar155._8_4_ * auVar84._8_4_;
      auVar124._12_4_ = auVar155._12_4_ * auVar84._12_4_;
      auVar81 = vfmsub231ps_fma(auVar124,auVar47,auVar55);
      auVar56._0_4_ = auVar157._0_4_ * auVar55._0_4_;
      auVar56._4_4_ = auVar157._4_4_ * auVar55._4_4_;
      auVar56._8_4_ = auVar157._8_4_ * auVar55._8_4_;
      auVar56._12_4_ = auVar157._12_4_ * auVar55._12_4_;
      auVar132 = vfmsub231ps_fma(auVar56,auVar155,auVar106);
      auVar107._0_4_ = auVar106._0_4_ * auVar47._0_4_;
      auVar107._4_4_ = auVar106._4_4_ * auVar47._4_4_;
      auVar107._8_4_ = auVar106._8_4_ * auVar47._8_4_;
      auVar107._12_4_ = auVar106._12_4_ * auVar47._12_4_;
      auVar82 = vfmsub231ps_fma(auVar107,auVar157,auVar84);
      auVar85._0_4_ = fVar16 * auVar82._0_4_;
      auVar85._4_4_ = fVar17 * auVar82._4_4_;
      auVar85._8_4_ = fVar18 * auVar82._8_4_;
      auVar85._12_4_ = fVar19 * auVar82._12_4_;
      auVar132 = vfmadd231ps_fma(auVar85,auVar65,auVar132);
      auVar164 = vfmadd231ps_fma(auVar132,auVar88,auVar81);
      auVar136._0_4_ = auVar164._0_4_ + auVar162._0_4_ + auVar48._0_4_;
      auVar136._4_4_ = auVar164._4_4_ + auVar162._4_4_ + auVar48._4_4_;
      auVar136._8_4_ = auVar164._8_4_ + auVar162._8_4_ + auVar48._8_4_;
      auVar136._12_4_ = auVar164._12_4_ + auVar162._12_4_ + auVar48._12_4_;
      auVar132 = vminps_avx(auVar162,auVar48);
      auVar81 = vminps_avx(auVar132,auVar164);
      auVar132 = vandps_avx(auVar136,auVar161);
      auVar108._0_4_ = auVar132._0_4_ * 1.1920929e-07;
      auVar108._4_4_ = auVar132._4_4_ * 1.1920929e-07;
      auVar108._8_4_ = auVar132._8_4_ * 1.1920929e-07;
      auVar108._12_4_ = auVar132._12_4_ * 1.1920929e-07;
      auVar115 = ZEXT1664(auVar108);
      uVar39 = CONCAT44(auVar108._4_4_,auVar108._0_4_);
      auVar125._0_8_ = uVar39 ^ 0x8000000080000000;
      auVar125._8_4_ = -auVar108._8_4_;
      auVar125._12_4_ = -auVar108._12_4_;
      auVar81 = vcmpps_avx(auVar81,auVar125,5);
      auVar82 = vmaxps_avx(auVar162,auVar48);
      auVar82 = vmaxps_avx(auVar82,auVar164);
      auVar82 = vcmpps_avx(auVar82,auVar108,2);
      auVar81 = vorps_avx(auVar81,auVar82);
      auVar82 = auVar74 & auVar81;
      if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar82 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar82[0xf])
      {
        auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
        auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        auVar93 = ZEXT1664(auVar74);
      }
      else {
        auVar57._0_4_ = fVar2 * auVar53._0_4_;
        auVar57._4_4_ = fVar10 * auVar53._4_4_;
        auVar57._8_4_ = fVar12 * auVar53._8_4_;
        auVar57._12_4_ = fVar15 * auVar53._12_4_;
        auVar86._0_4_ = fVar169 * auVar170._0_4_;
        auVar86._4_4_ = fVar174 * auVar170._4_4_;
        auVar86._8_4_ = fVar176 * auVar170._8_4_;
        auVar86._12_4_ = fVar182 * auVar170._12_4_;
        auVar164 = vfmsub213ps_fma(auVar170,auVar165,auVar57);
        auVar109._0_4_ = fVar1 * auVar47._0_4_;
        auVar109._4_4_ = fVar3 * auVar47._4_4_;
        auVar109._8_4_ = fVar11 * auVar47._8_4_;
        auVar109._12_4_ = fVar13 * auVar47._12_4_;
        auVar126._0_4_ = fVar169 * auVar155._0_4_;
        auVar126._4_4_ = fVar174 * auVar155._4_4_;
        auVar126._8_4_ = fVar176 * auVar155._8_4_;
        auVar126._12_4_ = fVar182 * auVar155._12_4_;
        auVar96 = vfmsub213ps_fma(auVar155,auVar156,auVar109);
        auVar82 = vandps_avx(auVar57,auVar161);
        auVar155 = vandps_avx(auVar109,auVar161);
        auVar82 = vcmpps_avx(auVar82,auVar155,1);
        auVar164 = vblendvps_avx(auVar96,auVar164,auVar82);
        auVar58._0_4_ = auVar157._0_4_ * fVar2;
        auVar58._4_4_ = auVar157._4_4_ * fVar10;
        auVar58._8_4_ = auVar157._8_4_ * fVar12;
        auVar58._12_4_ = auVar157._12_4_ * fVar15;
        auVar96 = vfmsub213ps_fma(auVar157,auVar165,auVar126);
        auVar110._0_4_ = fVar1 * auVar118._0_4_;
        auVar110._4_4_ = fVar3 * auVar118._4_4_;
        auVar110._8_4_ = fVar11 * auVar118._8_4_;
        auVar110._12_4_ = fVar13 * auVar118._12_4_;
        auVar170 = vfmsub213ps_fma(auVar53,auVar147,auVar110);
        auVar82 = vandps_avx(auVar110,auVar161);
        auVar155 = vandps_avx(auVar126,auVar161);
        auVar82 = vcmpps_avx(auVar82,auVar155,1);
        auVar96 = vblendvps_avx(auVar96,auVar170,auVar82);
        auVar118 = vfmsub213ps_fma(auVar118,auVar156,auVar86);
        auVar47 = vfmsub213ps_fma(auVar47,auVar147,auVar58);
        auVar82 = vandps_avx(auVar86,auVar161);
        auVar155 = vandps_avx(auVar58,auVar161);
        auVar82 = vcmpps_avx(auVar82,auVar155,1);
        auVar82 = vblendvps_avx(auVar47,auVar118,auVar82);
        local_38b8 = auVar28._0_4_;
        fStack_38b4 = auVar28._4_4_;
        fStack_38b0 = auVar28._8_4_;
        auVar59._0_4_ = auVar82._0_4_ * local_38b8;
        auVar59._4_4_ = auVar82._4_4_ * fStack_38b4;
        auVar59._8_4_ = auVar82._8_4_ * fStack_38b0;
        auVar59._12_4_ = auVar82._12_4_ * fVar19;
        auVar65 = vfmadd213ps_fma(auVar65,auVar96,auVar59);
        auVar65 = vfmadd213ps_fma(auVar88,auVar164,auVar65);
        auVar60._0_4_ = auVar65._0_4_ + auVar65._0_4_;
        auVar60._4_4_ = auVar65._4_4_ + auVar65._4_4_;
        auVar60._8_4_ = auVar65._8_4_ + auVar65._8_4_;
        auVar60._12_4_ = auVar65._12_4_ + auVar65._12_4_;
        auVar87._0_4_ = auVar82._0_4_ * fVar177;
        auVar87._4_4_ = auVar82._4_4_ * fVar173;
        auVar87._8_4_ = auVar82._8_4_ * fVar175;
        auVar87._12_4_ = auVar82._12_4_ * fVar181;
        auVar65 = vfmadd213ps_fma(auVar154,auVar96,auVar87);
        auVar88 = vfmadd213ps_fma(auVar89,auVar164,auVar65);
        auVar65 = vrcpps_avx(auVar60);
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar89 = vfnmadd213ps_fma(auVar65,auVar60,auVar141);
        auVar65 = vfmadd132ps_fma(auVar89,auVar65,auVar65);
        auVar127._0_4_ = (auVar88._0_4_ + auVar88._0_4_) * auVar65._0_4_;
        auVar127._4_4_ = (auVar88._4_4_ + auVar88._4_4_) * auVar65._4_4_;
        auVar127._8_4_ = (auVar88._8_4_ + auVar88._8_4_) * auVar65._8_4_;
        auVar127._12_4_ = (auVar88._12_4_ + auVar88._12_4_) * auVar65._12_4_;
        auVar65 = *(undefined1 (*) [16])(ray + 0x80);
        auVar88 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar127,2);
        auVar89 = vcmpps_avx(auVar127,auVar65,2);
        auVar88 = vandps_avx(auVar88,auVar89);
        uVar39 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
        auVar111._0_8_ = uVar39 ^ 0x8000000080000000;
        auVar111._8_4_ = -auVar60._8_4_;
        auVar111._12_4_ = -auVar60._12_4_;
        auVar115 = ZEXT1664(auVar111);
        auVar89 = vcmpps_avx(auVar60,auVar111,4);
        auVar88 = vandps_avx(auVar89,auVar88);
        auVar93 = ZEXT1664(auVar74);
        auVar81 = vandps_avx(auVar74,auVar81);
        auVar88 = vpslld_avx(auVar88,0x1f);
        auVar89 = vpsrad_avx(auVar88,0x1f);
        auVar88 = auVar81 & auVar89;
        if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar88 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar88 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar88[0xf]
           ) {
          auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
        }
        else {
          auVar88 = vandps_avx(auVar89,auVar81);
          uVar4 = *(uint *)(lVar36 + -0x10 + uVar43 * 4);
          pGVar8 = (context->scene->geometries).items[uVar4].ptr;
          uVar33 = pGVar8->mask;
          auVar90._4_4_ = uVar33;
          auVar90._0_4_ = uVar33;
          auVar90._8_4_ = uVar33;
          auVar90._12_4_ = uVar33;
          auVar81 = vpand_avx(auVar90,*(undefined1 (*) [16])(ray + 0x90));
          auVar81 = vpcmpeqd_avx(auVar81,_DAT_01f7aa10);
          auVar89 = auVar88 & ~auVar81;
          auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar89 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar89 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar89[0xf] < '\0') {
            uVar34 = *(undefined4 *)(lVar36 + uVar43 * 4);
            auVar88 = vandnps_avx(auVar81,auVar88);
            auVar115 = ZEXT1664(auVar88);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar81 = vrcpps_avx(auVar136);
              auVar142._8_4_ = 0x3f800000;
              auVar142._0_8_ = 0x3f8000003f800000;
              auVar142._12_4_ = 0x3f800000;
              auVar89 = vfnmadd213ps_fma(auVar136,auVar81,auVar142);
              auVar81 = vfmadd132ps_fma(auVar89,auVar81,auVar81);
              auVar63._8_4_ = 0x219392ef;
              auVar63._0_8_ = 0x219392ef219392ef;
              auVar63._12_4_ = 0x219392ef;
              auVar132 = vcmpps_avx(auVar132,auVar63,5);
              auVar132 = vandps_avx(auVar132,auVar81);
              auVar91._0_4_ = auVar132._0_4_ * auVar162._0_4_;
              auVar91._4_4_ = auVar132._4_4_ * auVar162._4_4_;
              auVar91._8_4_ = auVar132._8_4_ * auVar162._8_4_;
              auVar91._12_4_ = auVar132._12_4_ * auVar162._12_4_;
              auVar81 = vminps_avx(auVar91,auVar142);
              auVar64._0_4_ = auVar132._0_4_ * auVar48._0_4_;
              auVar64._4_4_ = auVar132._4_4_ * auVar48._4_4_;
              auVar64._8_4_ = auVar132._8_4_ * auVar48._8_4_;
              auVar64._12_4_ = auVar132._12_4_ * auVar48._12_4_;
              auVar132 = vminps_avx(auVar64,auVar142);
              auVar89 = vsubps_avx(auVar142,auVar81);
              auVar154 = vsubps_avx(auVar142,auVar132);
              auVar23._8_8_ = uVar32;
              auVar23._0_8_ = uVar31;
              local_36e8 = vblendvps_avx(auVar81,auVar89,auVar23);
              local_36d8 = vblendvps_avx(auVar132,auVar154,auVar23);
              local_36b8._4_4_ = uVar4;
              local_36b8._0_4_ = uVar4;
              local_36b8._8_4_ = uVar4;
              local_36b8._12_4_ = uVar4;
              local_36c8._4_4_ = uVar34;
              local_36c8._0_4_ = uVar34;
              local_36c8._8_4_ = uVar34;
              local_36c8._12_4_ = uVar34;
              vpcmpeqd_avx2(ZEXT1632(local_36d8),ZEXT1632(local_36d8));
              uStack_36a4 = context->user->instID[0];
              local_36a8 = uStack_36a4;
              uStack_36a0 = uStack_36a4;
              uStack_369c = uStack_36a4;
              uStack_3698 = context->user->instPrimID[0];
              uStack_3694 = uStack_3698;
              uStack_3690 = uStack_3698;
              uStack_368c = uStack_3698;
              auVar132 = vblendvps_avx(auVar65,auVar127,auVar88);
              *(undefined1 (*) [16])(ray + 0x80) = auVar132;
              args.valid = (int *)local_3878;
              args.geometryUserPtr = pGVar8->userPtr;
              args.context = context->user;
              args.hit = local_3718;
              args.N = 4;
              local_3878 = auVar88;
              args.ray = (RTCRayN *)ray;
              local_3718 = (RTCHitN  [16])auVar164;
              local_3708 = auVar96;
              local_36f8 = auVar82;
              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar180._0_8_ = (*pGVar8->occlusionFilterN)(&args);
                auVar180._8_56_ = extraout_var_01;
                auVar132 = auVar180._0_16_;
                auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
                auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar115 = ZEXT1664(local_3878);
              }
              auVar116 = auVar115._16_48_;
              auVar88 = auVar115._0_16_;
              if (auVar88 == (undefined1  [16])0x0) {
                auVar88 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                auVar88 = auVar88 ^ _DAT_01f7ae20;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar93._0_8_ = (*p_Var9)(&args);
                  auVar93._8_56_ = extraout_var_02;
                  auVar132 = auVar93._0_16_;
                  auVar180 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)))
                  ;
                  auVar172 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)))
                  ;
                  auVar168 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar88 = local_3878;
                }
                auVar81 = vpcmpeqd_avx(auVar88,_DAT_01f7aa10);
                auVar88 = vpcmpeqd_avx(auVar132,auVar132);
                auVar88 = auVar81 ^ auVar88;
                auVar113._8_4_ = 0xff800000;
                auVar113._0_8_ = 0xff800000ff800000;
                auVar113._12_4_ = 0xff800000;
                auVar116 = (undefined1  [48])0x0;
                auVar132 = vblendvps_avx(auVar113,*(undefined1 (*) [16])(args.ray + 0x80),auVar81);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar132;
              }
              auVar88 = vpslld_avx(auVar88,0x1f);
              auVar115._0_16_ = vpsrad_avx(auVar88,0x1f);
              auVar115._16_48_ = auVar116;
              auVar65 = vblendvps_avx(auVar65,*(undefined1 (*) [16])local_3860,auVar88);
              *(undefined1 (*) [16])local_3860 = auVar65;
            }
            auVar74 = vandnps_avx(auVar115._0_16_,auVar74);
            auVar93 = ZEXT1664(auVar74);
          }
        }
      }
      auVar74 = auVar93._0_16_;
      if (((((auVar74 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar74 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar74 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar93[0xf])
         || (bVar46 = 2 < uVar43, uVar43 = uVar43 + 1, bVar46)) break;
    }
    auVar65 = vandps_avx(auVar74,auVar75);
    auVar75 = auVar75 & auVar74;
    if ((((auVar75 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar75[0xf])
    break;
  }
  auVar74 = vpcmpeqd_avx(auVar115._0_16_,auVar115._0_16_);
  aVar66._0_4_ = auVar65._0_4_ ^ auVar74._0_4_;
  aVar66._4_4_ = auVar65._4_4_ ^ auVar74._4_4_;
  aVar66._8_4_ = auVar65._8_4_ ^ auVar74._8_4_;
  aVar66._12_4_ = auVar65._12_4_ ^ auVar74._12_4_;
LAB_005ae27e:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar66);
  auVar74 = auVar74 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar74 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar74 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar74[0xf])
  goto LAB_005ae395;
  auVar114._8_4_ = 0xff800000;
  auVar114._0_8_ = 0xff800000ff800000;
  auVar114._12_4_ = 0xff800000;
  auVar115 = ZEXT1664(auVar114);
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar114,
                     (undefined1  [16])terminated.field_0);
  goto LAB_005ad10d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }